

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mser.c
# Opt level: O1

void mser_process(MserFilt *f,uchar *im)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uchar uVar5;
  uchar uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  uint *puVar12;
  int *piVar13;
  int *piVar14;
  int *piVar15;
  int *piVar16;
  MserReg *pMVar17;
  bool bVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  MserExtrReg *__ptr;
  uint *__ptr_00;
  uint uVar22;
  uint uVar23;
  MserExtrReg *pMVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  uint uVar36;
  float fVar37;
  uint buckets [256];
  uint local_438 [258];
  ulong uVar35;
  
  uVar7 = f->nel;
  lVar20 = (long)(int)uVar7;
  puVar11 = f->perm;
  puVar12 = f->joins;
  uVar36 = f->ndims;
  piVar13 = f->dims;
  piVar14 = f->subs;
  piVar15 = f->dsubs;
  piVar16 = f->strides;
  pMVar17 = f->r;
  __ptr = f->er;
  __ptr_00 = f->mer;
  iVar19 = f->delta;
  f->nell = 0;
  memset(local_438,0,0x400);
  if (0 < lVar20) {
    lVar21 = 0;
    do {
      local_438[im[lVar21]] = local_438[im[lVar21]] + 1;
      lVar21 = lVar21 + 1;
    } while (lVar20 != lVar21);
  }
  lVar21 = 1;
  do {
    local_438[0] = local_438[0] + local_438[lVar21];
    local_438[lVar21] = local_438[0];
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x100);
  lVar21 = lVar20;
  if (0 < (int)uVar7) {
    do {
      uVar29 = local_438[im[lVar21 + -1]];
      local_438[im[lVar21 + -1]] = uVar29 - 1;
      puVar11[uVar29 - 1] = (uint)(lVar21 + -1);
      bVar18 = 1 < lVar21;
      lVar21 = lVar21 + -1;
    } while (bVar18);
  }
  if (0 < (int)uVar7) {
    lVar21 = 0;
    do {
      *(undefined4 *)((long)&pMVar17->parent + lVar21) = 0xffffffff;
      lVar21 = lVar21 + 0x10;
    } while (lVar20 << 4 != lVar21);
  }
  if ((int)uVar7 < 1) {
    iVar26 = 0;
    iVar27 = 0;
  }
  else {
    lVar21 = 0;
    iVar27 = 0;
    iVar26 = 0;
    do {
      uVar29 = puVar11[lVar21];
      uVar34 = (ulong)uVar29;
      uVar5 = im[uVar34];
      pMVar17[uVar34].parent = uVar29;
      pMVar17[uVar34].shortcut = uVar29;
      pMVar17[uVar34].height = 1;
      pMVar17[uVar34].area = 1;
      uVar33 = uVar29;
      if (0 < (int)uVar36) {
        uVar31 = (ulong)uVar29;
        lVar30 = (ulong)uVar36 + 1;
        do {
          piVar15[lVar30 + -2] = -1;
          piVar14[lVar30 + -2] = (int)(uVar31 / (uint)piVar16[lVar30 + -2]);
          uVar31 = uVar31 % (ulong)(uint)piVar16[lVar30 + -2];
          lVar30 = lVar30 + -1;
        } while (1 < lVar30);
      }
LAB_00102ddb:
      do {
        if ((int)uVar36 < 1) {
          bVar18 = true;
          uVar22 = 0;
        }
        else {
          uVar22 = 0;
          lVar30 = 1;
          do {
            iVar32 = piVar14[lVar30 + -1] + piVar15[lVar30 + -1];
            if (iVar32 < 0) {
              bVar18 = false;
            }
            else {
              bVar18 = iVar32 < piVar13[lVar30 + -1];
            }
            uVar22 = uVar22 + iVar32 * piVar16[lVar30 + -1];
          } while ((lVar30 < (int)uVar36) && (lVar30 = lVar30 + 1, bVar18));
        }
        if ((bVar18) && ((uVar22 != uVar29 && (pMVar17[uVar22].parent != 0xffffffff)))) {
          uVar8 = pMVar17[uVar33].height;
          uVar9 = pMVar17->height;
          uVar31 = uVar34;
          uVar28 = uVar34;
          do {
            uVar35 = uVar31;
            uVar33 = (uint)uVar35;
            uVar10 = pMVar17[uVar35].shortcut;
            pMVar17[uVar35].shortcut = (uint)uVar28;
            uVar28 = uVar35;
            uVar31 = (ulong)uVar10;
          } while (uVar10 != uVar33);
          do {
            uVar25 = (uint)uVar28;
            uVar10 = pMVar17[uVar28].shortcut;
            pMVar17[uVar28].shortcut = uVar33;
            uVar28 = (ulong)uVar10;
            uVar23 = uVar22;
          } while (uVar10 != uVar25);
          do {
            uVar10 = uVar23;
            uVar28 = (ulong)uVar10;
            uVar23 = pMVar17[uVar28].shortcut;
            pMVar17[uVar28].shortcut = uVar22;
            uVar31 = uVar28;
            uVar22 = uVar10;
          } while (uVar23 != uVar10);
          do {
            uVar23 = (uint)uVar31;
            uVar22 = pMVar17[uVar31].shortcut;
            pMVar17[uVar31].shortcut = uVar10;
            uVar31 = (ulong)uVar22;
          } while (uVar22 != uVar23);
          if (uVar33 != uVar10) {
            uVar6 = im[uVar28];
            if ((uVar6 == uVar5) && ((int)uVar8 < (int)uVar9)) {
              pMVar17[uVar35].parent = uVar10;
              pMVar17[uVar35].shortcut = uVar10;
              pMVar17[uVar28].area = pMVar17[uVar28].area + pMVar17[uVar35].area;
              uVar22 = uVar8 + 1;
              if ((int)(uVar8 + 1) < (int)uVar9) {
                uVar22 = uVar9;
              }
              pMVar17[uVar28].height = uVar22;
              puVar12[iVar27] = uVar33;
              iVar27 = iVar27 + 1;
            }
            else {
              pMVar17[uVar28].parent = uVar33;
              pMVar17[uVar28].shortcut = uVar33;
              pMVar17[uVar35].area = pMVar17[uVar35].area + pMVar17[uVar28].area;
              uVar22 = uVar9 + 1;
              if ((int)(uVar9 + 1) < (int)uVar8) {
                uVar22 = uVar8;
              }
              pMVar17[uVar35].height = uVar22;
              puVar12[iVar27] = uVar10;
              iVar26 = iVar26 + (uint)(uVar6 != uVar5);
              iVar27 = iVar27 + 1;
            }
          }
        }
        uVar31 = 0;
        do {
          iVar32 = piVar15[uVar31];
          piVar15[uVar31] = iVar32 + 1;
          if (iVar32 < 1) goto LAB_00102ddb;
          piVar15[uVar31] = -1;
          uVar31 = uVar31 + 1;
        } while (uVar36 != uVar31);
      } while (iVar32 < 1);
      lVar21 = lVar21 + 1;
    } while (lVar21 != lVar20);
  }
  iVar32 = iVar26 + 1;
  f->njoins = iVar27;
  (f->stats).num_extremal = iVar32;
  if (f->rer <= iVar26) {
    if (__ptr != (MserExtrReg *)0x0) {
      free(__ptr);
    }
    __ptr = (MserExtrReg *)malloc((long)iVar32 * 0x1c);
    f->er = __ptr;
    f->rer = iVar32;
  }
  f->nmer = iVar32;
  uVar36 = 0;
  if (0 < (int)uVar7 && __ptr != (MserExtrReg *)0x0) {
    lVar21 = 0;
    uVar36 = 0;
    do {
      uVar29 = puVar11[lVar21];
      if ((uVar29 == pMVar17[uVar29].parent) || (im[uVar29] < im[pMVar17[uVar29].parent])) {
        __ptr[(int)uVar36].index = uVar29;
        __ptr[(int)uVar36].parent = uVar36;
        __ptr[(int)uVar36].value = im[uVar29];
        __ptr[(int)uVar36].area = pMVar17[uVar29].area;
        pMVar17[uVar29].shortcut = uVar36;
        uVar36 = uVar36 + 1;
      }
      else {
        pMVar17[uVar29].shortcut = 0xffffffff;
      }
      lVar21 = lVar21 + 1;
    } while (lVar20 != lVar21);
  }
  uVar34 = (ulong)uVar36;
  if (0 < (int)uVar36) {
    uVar31 = 0;
    do {
      uVar28 = (ulong)(uint)__ptr[uVar31].index;
      do {
        uVar28 = (ulong)pMVar17[uVar28].parent;
      } while (pMVar17[uVar28].shortcut == 0xffffffff);
      __ptr[uVar31].parent = pMVar17[uVar28].shortcut;
      __ptr[uVar31].shortcut = (uint)uVar31;
      uVar31 = uVar31 + 1;
    } while (uVar31 != uVar34);
  }
  if (0 < (int)uVar36) {
    uVar31 = 0;
    do {
      pMVar24 = __ptr + uVar31;
      iVar26 = (uint)__ptr[uVar31].value + iVar19;
      uVar29 = __ptr[uVar31].shortcut;
      do {
        uVar33 = __ptr[(int)uVar29].parent;
        if (uVar33 == uVar29) {
          bVar18 = false;
          uVar33 = uVar29;
        }
        else {
          bVar18 = (int)(uint)__ptr[(int)uVar33].value <= iVar26;
          if (iVar26 < (int)(uint)__ptr[(int)uVar33].value) {
            uVar33 = uVar29;
          }
        }
        uVar29 = uVar33;
      } while (bVar18);
      pMVar24->variation =
           (float)(int)(__ptr[(int)uVar29].area - pMVar24->area) / (float)(int)pMVar24->area;
      pMVar24->max_stable = 1;
      uVar33 = __ptr[pMVar24->parent].shortcut;
      if ((int)__ptr[pMVar24->parent].shortcut < (int)uVar29) {
        uVar33 = uVar29;
      }
      __ptr[pMVar24->parent].shortcut = uVar33;
      uVar31 = uVar31 + 1;
    } while (uVar31 != uVar34);
  }
  uVar29 = uVar36;
  if (0 < (int)uVar36) {
    uVar31 = 0;
    pMVar24 = __ptr;
    do {
      uVar28 = (ulong)(uint)pMVar24->parent;
      if ((uint)__ptr[uVar28].value <= pMVar24->value + 1) {
        if (__ptr[uVar28].variation < pMVar24->variation ||
            __ptr[uVar28].variation == pMVar24->variation) {
          uVar28 = uVar31 & 0xffffffff;
        }
        if (__ptr[uVar28].max_stable != 0) {
          uVar29 = uVar29 - 1;
          __ptr[uVar28].max_stable = 0;
        }
      }
      uVar31 = uVar31 + 1;
      pMVar24 = pMVar24 + 1;
    } while (uVar34 != uVar31);
  }
  (f->stats).num_unstable = uVar36 - uVar29;
  if ((int)uVar36 < 1) {
    iVar26 = 0;
    iVar32 = 0;
    iVar27 = 0;
    iVar19 = 0;
  }
  else {
    fVar1 = f->max_area;
    fVar2 = f->min_area;
    fVar3 = f->max_variation;
    fVar4 = f->min_diversity;
    iVar19 = 0;
    iVar27 = 0;
    iVar32 = 0;
    iVar26 = 0;
    uVar31 = uVar34;
    do {
      if (__ptr[uVar31 - 1].max_stable == 0) goto LAB_001032fe;
      pMVar24 = __ptr + -1 + uVar31;
      if (fVar3 <= pMVar24->variation) {
        iVar32 = iVar32 + 1;
LAB_001032f4:
        pMVar24->max_stable = 0;
        uVar29 = uVar29 - 1;
      }
      else {
        fVar37 = (float)pMVar24->area;
        if (fVar1 * (float)uVar7 < fVar37) {
          iVar19 = iVar19 + 1;
          goto LAB_001032f4;
        }
        if (fVar37 < (float)uVar7 * fVar2) {
          iVar27 = iVar27 + 1;
          goto LAB_001032f4;
        }
        if (fVar4 < 1.0) {
          uVar28 = (ulong)(uint)pMVar24->parent;
          bVar18 = true;
          if (uVar31 - 1 != uVar28) {
            do {
              uVar22 = (uint)uVar28;
              uVar33 = uVar22;
              if (__ptr[uVar28].max_stable != 0) break;
              uVar33 = __ptr[uVar28].parent;
              uVar28 = (ulong)uVar33;
            } while (uVar33 != uVar22);
            if ((float)(int)(__ptr[uVar33].area - pMVar24->area) / (float)(int)__ptr[uVar33].area <
                fVar4) {
              iVar26 = iVar26 + 1;
              bVar18 = false;
            }
          }
          if (!bVar18) goto LAB_001032f4;
        }
      }
LAB_001032fe:
      bVar18 = 1 < (long)uVar31;
      uVar31 = uVar31 - 1;
    } while (bVar18);
  }
  (f->stats).num_abs_unstable = iVar32;
  (f->stats).num_too_big = iVar19;
  (f->stats).num_too_small = iVar27;
  (f->stats).num_duplicates = iVar26;
  if (f->rmer < (int)uVar29) {
    if (__ptr_00 != (uint *)0x0) {
      free(__ptr_00);
    }
    __ptr_00 = (uint *)malloc((long)(int)uVar29 * 4);
    f->mer = __ptr_00;
    f->rmer = uVar29;
  }
  f->nmer = uVar29;
  if (0 < (int)uVar36 && (__ptr_00 != (uint *)0x0 && __ptr != (MserExtrReg *)0x0)) {
    lVar20 = 0;
    iVar19 = 0;
    do {
      if (*(int *)((long)&__ptr->max_stable + lVar20) != 0) {
        lVar21 = (long)iVar19;
        iVar19 = iVar19 + 1;
        __ptr_00[lVar21] = *(uint *)((long)&__ptr->index + lVar20);
      }
      lVar20 = lVar20 + 0x1c;
    } while (uVar34 * 0x1c != lVar20);
  }
  return;
}

Assistant:

void
mser_process(MserFilt *f, unsigned char const *im) {
    /* shortcuts */
    unsigned int nel = f->nel;
    unsigned int *perm = f->perm;
    unsigned int *joins = f->joins;
    int ndims = f->ndims;
    int *dims = f->dims;
    int *subs = f->subs;
    int *dsubs = f->dsubs;
    int *strides = f->strides;
    MserReg *r = f->r;
    MserExtrReg *er = f->er;
    unsigned int *mer = f->mer;
    int delta = f->delta;

    int njoins = 0;
    int ner = 0;
    int nmer = 0;
    int nbig = 0;
    int nsmall = 0;
    int nbad = 0;
    int ndup = 0;

    int i, j, k;

    /* delete any previosuly computed ellipsoid */
    f->nell = 0;


    /* -----------------------------------------------------------------
    *                                          Sort pixels by intensity
    * -------------------------------------------------------------- */

    {
        unsigned int buckets[MSER_PIX_MAXVAL];

        /* clear buckets */
        memset(buckets, 0, sizeof(unsigned int) * MSER_PIX_MAXVAL);


        /* compute bucket size (how many pixels for each intensity
        * value) */
        for (i = 0; i < (int) nel; ++i) {
            unsigned char v = im[i];
            ++buckets[v];
        }

        /* cumulatively add bucket sizes */
        for (i = 1; i < MSER_PIX_MAXVAL; ++i) {
            buckets[i] += buckets[i - 1];
        }

        /* empty buckets computing pixel ordering */
        for (i = nel; i >= 1;) {
            unsigned char v = im[--i];
            unsigned int j = --buckets[v];
            perm[j] = i;
        }
    }

    /* initialize the forest with all void nodes */
    for (i = 0; i < (int) nel; ++i) {
        r[i].parent = MSER_VOID_NODE;
    }


    /* -----------------------------------------------------------------
    *                        Compute regions and count extremal regions
    * -------------------------------------------------------------- */


    /*
    * In the following:
    * idx    : index of the current pixel
    * val    : intensity of the current pixel
    * r_idx  : index of the root of the current pixel
    * n_idx  : index of the neighbors of the current pixel
    * nr_idx : index of the root of the neighbor of the current pixel
    */

    /* process each pixel by increasing intensity */
    for (i = 0; i < (int) nel; ++i) {
        /* pop next node xi */
        unsigned int idx = perm[i];
        unsigned char val = im[idx];
        unsigned int r_idx;

        /* add the pixel to the forest as a root for now */
        r[idx].parent = idx;
        r[idx].shortcut = idx;
        r[idx].area = 1;
        r[idx].height = 1;

        r_idx = idx;


        /* convert the index IDX into the subscript SUBS; also initialize
        * DSUBS to (-1,-1,...,-1) */
        {
            unsigned int temp = idx;
            for (k = ndims - 1; k >= 0; --k) {
                dsubs[k] = -1;
                subs[k] = temp / strides[k];
                temp = temp % strides[k];
            }
        }

        /* examine the neighbors of the current pixel */
        while (1) {
            unsigned int n_idx = 0;
            int good = 1;


            /*
            * Compute the neighbor subscript as NSUBS+SUB, the
            * corresponding neighbor index NINDEX and check that the
            * neighbor is within the image domain.
            */
            for (k = 0; k < ndims && good; ++k) {
                int temp = dsubs[k] + subs[k];
                good &= (0 <= temp) && (temp < dims[k]);
                n_idx += temp * strides[k];
            }


            /*
            * The neighbor should be processed if the following conditions
            * are met:
            * 1. The neighbor is within image boundaries.
            * 2. The neighbor is indeed different from the current node
            * (the opposite happens when DSUB=(0,0,...,0)).
            * 3. The neighbor is already in the forest, meaning that it has
            * already been processed.
            */
            if (good &&
                n_idx != idx &&
                r[n_idx].parent != MSER_VOID_NODE) {
                unsigned char nr_val = 0;
                unsigned int nr_idx = 0;
                int hgt = r[r_idx].height;
                int n_hgt = r[nr_idx].height;


                /*
                * Now we join the two subtrees rooted at
                * R_IDX = ROOT(  IDX)
                * NR_IDX = ROOT(N_IDX).
                * Note that R_IDX = ROOT(IDX) might change as we process more
                * neighbors, so we need keep updating it.
                */

                r_idx = climb(r, idx);
                nr_idx = climb(r, n_idx);


                /*
                * At this point we have three possibilities:
                * (A) ROOT(IDX) == ROOT(NR_IDX). In this case the two trees
                * have already been joined and we do not do anything.
                * (B) I(ROOT(IDX)) == I(ROOT(NR_IDX)). In this case the pixel
                * IDX is extending an extremal region with the same
                * intensity value. Since ROOT(NR_IDX) will NOT be an
                * extremal region of the full image, ROOT(IDX) can be
                * safely added as children of ROOT(NR_IDX) if this
                * reduces the height according to the union rank
                * heuristic.
                * (C) I(ROOT(IDX)) > I(ROOT(NR_IDX)). In this case the pixel
                * IDX is starting a new extremal region. Thus ROOT(NR_IDX)
                * WILL be an extremal region of the final image and the
                * only possibility is to add ROOT(NR_IDX) as children of
                * ROOT(IDX), which becomes parent.
                */

                if (r_idx != nr_idx) /* skip if (A) */

                {
                    nr_val = im[nr_idx];

                    if (nr_val == val && hgt < n_hgt) {
                        /* ROOT(IDX) becomes the child */
                        r[r_idx].parent = nr_idx;
                        r[r_idx].shortcut = nr_idx;
                        r[nr_idx].area += r[r_idx].area;
                        r[nr_idx].height = MAX(n_hgt, hgt + 1);

                        joins[njoins++] = r_idx;
                    } else {
                        /* cases ROOT(IDX) becomes the parent */
                        r[nr_idx].parent = r_idx;
                        r[nr_idx].shortcut = r_idx;
                        r[r_idx].area += r[nr_idx].area;
                        r[r_idx].height = MAX(hgt, n_hgt + 1);

                        joins[njoins++] = nr_idx;

                        /* count if extremal */
                        if (nr_val != val)
                            ++ner;
                    }       /* check b vs c */
                }               /* check a vs b or c */
            }                       /* neighbor done */

            /* move to next neighbor */
            k = 0;
            while (++dsubs[k] > 1) {
                dsubs[k++] = -1;
                if (k == ndims)
                    goto done_all_neighbors;
            }
        } /* next neighbor */
        done_all_neighbors:;
    }        /* next pixel */

    /* the last root is extremal too */
    ++ner;

    /* save back */
    f->njoins = njoins;

    f->stats.num_extremal = ner;


    /* -----------------------------------------------------------------
    *                                          Extract extremal regions
    * -------------------------------------------------------------- */


    /*
    * Extremal regions are extracted and stored into the array ER.  The
    * structure R is also updated so that .SHORTCUT indexes the
    * corresponding extremal region if any (otherwise it is set to
    * VOID).
    */

    /* make room */
    if (f->rer < ner) {
        if (er)
            free(er);
        f->er = er = (MserExtrReg *) malloc(sizeof(MserExtrReg) * ner);
        f->rer = ner;
    };

    /* save back */
    f->nmer = ner;

    /* count again */
    ner = 0;

    /* scan all regions Xi */
    if (er != NULL) {
        for (i = 0; i < (int) nel; ++i) {
            /* pop next node xi */
            unsigned int idx = perm[i];

            unsigned char val = im[idx];
            unsigned int p_idx = r[idx].parent;
            unsigned char p_val = im[p_idx];

            /* is extremal ? */
            int is_extr = (p_val > val) || idx == p_idx;

            if (is_extr) {
                /* if so, add it */
                er[ner].index = idx;
                er[ner].parent = ner;
                er[ner].value = im[idx];
                er[ner].area = r[idx].area;

                /* link this region to this extremal region */
                r[idx].shortcut = ner;

                /* increase count */
                ++ner;
            } else {
                /* link this region to void */
                r[idx].shortcut = MSER_VOID_NODE;
            }
        }
    }


    /* -----------------------------------------------------------------
    *                                   Link extremal regions in a tree
    * -------------------------------------------------------------- */

    for (i = 0; i < ner; ++i) {
        unsigned int idx = er[i].index;

        do {
            idx = r[idx].parent;
        } while (r[idx].shortcut == MSER_VOID_NODE);

        er[i].parent = r[idx].shortcut;
        er[i].shortcut = i;
    }


    /* -----------------------------------------------------------------
    *                            Compute variability of +DELTA branches
    * -------------------------------------------------------------- */


    /* For each extremal region Xi of value VAL we look for the biggest
    * parent that has value not greater than VAL+DELTA. This is dubbed
    * `top parent'. */

    for (i = 0; i < ner; ++i) {
        /* Xj is the current region the region and Xj are the parents */
        int top_val = er[i].value + delta;
        int top = er[i].shortcut;

        /* examine all parents */
        while (1) {
            int next = er[top].parent;
            int next_val = er[next].value;


            /* Break if:
            * - there is no node above the top or
            * - the next node is above the top value.
            */
            if (next == top || next_val > top_val)
                break;

            /* so next could be the top */
            top = next;
        }

        /* calculate branch variation */
        {
            int area = er[i].area;
            int area_top = er[top].area;
            er[i].variation = (float) (area_top - area) / area;
            er[i].max_stable = 1;
        }


        /* Optimization: since extremal regions are processed by
        * increasing intensity, all next extremal regions being processed
        * have value at least equal to the one of Xi. If any of them has
        * parent the parent of Xi (this comprises the parent itself), we
        * can safely skip most intermediate node along the branch and
        * skip directly to the top to start our search. */
        {
            int parent = er[i].parent;
            int curr = er[parent].shortcut;
            er[parent].shortcut = MAX(top, curr);
        }
    }


    /* -----------------------------------------------------------------
    *                                  Select maximally stable branches
    * -------------------------------------------------------------- */

    nmer = ner;
    for (i = 0; i < ner; ++i) {
        unsigned int parent = er[i].parent;
        unsigned char val = er[i].value;
        float var = er[i].variation;
        unsigned char p_val = er[parent].value;
        float p_var = er[parent].variation;
        unsigned int loser;


        /*
        * Notice that R_parent = R_{l+1} only if p_val = val + 1. If not,
        * this and the parent region coincide and there is nothing to do.
        */
        if (p_val > val + 1)
            continue;

        /* decide which one to keep and put that in loser */
        if (var < p_var)
            loser = parent;
        else loser = i;

        /* make loser NON maximally stable */
        if (er[loser].max_stable) {
            --nmer;
            er[loser].max_stable = 0;
        }
    }

    f->stats.num_unstable = ner - nmer;


    /* -----------------------------------------------------------------
    *                                                 Further filtering
    * -------------------------------------------------------------- */


    /* It is critical for correct duplicate detection to remove regions
    * from the bottom (smallest one first).                          */
    {
        float max_area = (float) f->max_area * nel;
        float min_area = (float) f->min_area * nel;
        float max_var = (float) f->max_variation;
        float min_div = (float) f->min_diversity;

        /* scan all extremal regions (intensity value order) */
        for (i = ner - 1; i >= 0L; --i) {
            /* process only maximally stable extremal regions */
            if (!er[i].max_stable)
                continue;

            if (er[i].variation >= max_var) {
                ++nbad;
                goto remove;
            }
            if (er[i].area > max_area) {
                ++nbig;
                goto remove;
            }
            if (er[i].area < min_area) {
                ++nsmall;
                goto remove;
            }


            /*
            * Remove duplicates
            */
            if (min_div < 1.0) {
                unsigned int parent = er[i].parent;
                int area, p_area;
                float div;

                /* check all but the root mser */
                if ((int) parent != i) {
                    /* search for the maximally stable parent region */
                    while (!er[parent].max_stable) {
                        unsigned int next = er[parent].parent;
                        if (next == parent)
                            break;
                        parent = next;
                    }


                    /* Compare with the parent region; if the current and parent
                    * regions are too similar, keep only the parent. */
                    area = er[i].area;
                    p_area = er[parent].area;
                    div = (float) (p_area - area) / (float) p_area;

                    if (div < min_div) {
                        ++ndup;
                        goto remove;
                    }
                } /* remove dups end */
            }
            continue;
            remove:
            er[i].max_stable = 0;
            --nmer;
        }         /* check next region */

        f->stats.num_abs_unstable = nbad;
        f->stats.num_too_big = nbig;
        f->stats.num_too_small = nsmall;
        f->stats.num_duplicates = ndup;
    }


    /* -----------------------------------------------------------------
    *                                                   Save the result
    * -------------------------------------------------------------- */

    /* make room */
    if (f->rmer < nmer) {
        if (mer)
            free(mer);
        f->mer = mer = (unsigned int *) malloc(sizeof(unsigned int) * nmer);
        f->rmer = nmer;
    }

    /* save back */
    f->nmer = nmer;

    j = 0;
    if (er != NULL && mer != NULL) {
        for (i = 0; i < ner; ++i) {
            if (er[i].max_stable)
                mer[j++] = er[i].index;
        }
    }
}